

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

ftrl_data<float> * readFromlibsvm<float>(ftrl_data<float> *__return_storage_ptr__,char *cdata)

{
  double dVar1;
  byte bVar2;
  int iVar3;
  undefined8 in_RAX;
  byte bVar4;
  uint uVar5;
  undefined8 local_38;
  
  (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->indexs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->indexs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->indexs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = *cdata;
  uVar5 = 0;
  local_38 = in_RAX;
  bVar4 = 0x20;
  while( true ) {
    while( true ) {
      if (bVar2 == 0) {
        return __return_storage_ptr__;
      }
      if (bVar4 == 0x20) break;
      dVar1 = atof(cdata + uVar5 + 1);
      local_38 = CONCAT44(local_38._4_4_,(float)dVar1);
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                (&__return_storage_ptr__->data,(float *)&local_38);
      while (bVar2 = cdata[uVar5], bVar4 = bVar2, (bVar2 & 0xdf) != 0) {
        uVar5 = uVar5 + 1;
      }
    }
    if (cdata[uVar5 + 1] == '\n') break;
    iVar3 = atoi(cdata + uVar5);
    local_38 = CONCAT44(iVar3 + -1,(float)local_38);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&__return_storage_ptr__->indexs,(uint *)((long)&local_38 + 4));
    for (; (bVar2 = cdata[uVar5], bVar4 = bVar2, bVar2 != 0 && (bVar2 != 0x3a)); uVar5 = uVar5 + 1)
    {
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ftrl_data<T> readFromlibsvm(const char * cdata) {
    unsigned int begin = 0;
    ftrl_data<T> data;
    char prefix = ' ';
    while (cdata[begin] != '\0') {
        if (prefix == ' ') {
            if (cdata[begin + 1] == '\n') { //if there is a \n after a space, then we go to next line
                break;
            }
            data.indexs.push_back((unsigned int)atoi(cdata + begin) - 1);
            while (cdata[begin] != '\0' && cdata[begin] != ':') {
                ++begin;
            }
        } else {
            data.data.push_back((float)atof(cdata + begin + 1));
            while (cdata[begin] != '\0' && cdata[begin] != ' ') {
                ++begin;
            }
        }
        prefix = cdata[begin];
    }
    return data;
}